

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srv_state.hxx
# Opt level: O2

void __thiscall nuraft::srv_state::inc_term(srv_state *this)

{
  unsigned_long uVar1;
  
  if ((this->inc_term_cb_).super__Function_base._M_manager == (_Manager_type)0x0) {
    LOCK();
    (this->term_).super___atomic_base<unsigned_long>._M_i =
         (this->term_).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  else {
    uVar1 = std::function<unsigned_long_(unsigned_long)>::operator()
                      (&this->inc_term_cb_,(this->term_).super___atomic_base<unsigned_long>._M_i);
    LOCK();
    (this->term_).super___atomic_base<unsigned_long>._M_i = uVar1;
    UNLOCK();
  }
  return;
}

Assistant:

void inc_term() {
        if (inc_term_cb_) {
            ulong new_term = inc_term_cb_(term_);
            assert(new_term > term_);
            term_ = new_term;
            return;
        }
        term_++;
    }